

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeSignedInteger(Parser *this,int *output,char *error)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int *in_RSI;
  char *in_RDI;
  uint64 value;
  uint64 max_value;
  bool is_negative;
  uint64 in_stack_00000040;
  Parser *in_stack_00000048;
  Parser *in_stack_ffffffffffffffc8;
  bool local_1;
  
  bVar1 = TryConsume(in_stack_ffffffffffffffc8,in_RDI);
  iVar3 = 0;
  bVar2 = ConsumeInteger64(in_stack_00000048,in_stack_00000040,(uint64 *)this,(char *)output);
  if (bVar2) {
    if (bVar1) {
      iVar3 = -iVar3;
    }
    *in_RSI = iVar3;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Parser::ConsumeSignedInteger(int* output, const char* error) {
  bool is_negative = false;
  uint64 max_value = kint32max;
  if (TryConsume("-")) {
    is_negative = true;
    max_value += 1;
  }
  uint64 value = 0;
  DO(ConsumeInteger64(max_value, &value, error));
  if (is_negative) value *= -1;
  *output = value;
  return true;
}